

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O3

int Gia_FormStrCount(char *pStr,int *pnVars,int *pnPars)

{
  int iVar1;
  size_t sVar2;
  byte *pbVar3;
  char cVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  char *pcVar9;
  int *piVar10;
  
  if (*pStr == '(') {
    sVar2 = strlen(pStr);
    if (pStr[sVar2 - 1] == ')') {
      pcVar9 = pStr + 1;
      iVar1 = 0;
      cVar4 = '(';
      do {
        if (cVar4 == '(') {
          iVar1 = iVar1 + 1;
        }
        else if (cVar4 == ')') {
          iVar1 = iVar1 + -1;
        }
        else if (cVar4 == '\0') goto LAB_00595a16;
        cVar4 = *pcVar9;
        pcVar9 = pcVar9 + 1;
      } while( true );
    }
    pcVar9 = "The last symbol should be the closing parenthesis \")\".";
  }
  else {
    pcVar9 = "The first symbol should be the opening parenthesis \"(\".";
  }
  goto LAB_00595a21;
LAB_00595a16:
  if (iVar1 == 0) {
    *pnVars = 0;
    *pnPars = 0;
    bVar5 = *pStr;
    if (bVar5 != 0) {
      pbVar3 = (byte *)(pStr + 1);
      do {
        iVar1 = -0x60;
        uVar6 = (uint)bVar5;
        piVar10 = pnVars;
        if (((byte)(bVar5 + 0x9f) < 2) || (iVar1 = -0x6f, piVar10 = pnPars, (bVar5 & 0xfc) == 0x70))
        {
          iVar8 = iVar1 + uVar6;
          if ((int)(iVar1 + uVar6) < *piVar10) {
            iVar8 = *piVar10;
          }
          *piVar10 = iVar8;
        }
        else if (((0x38 < uVar6 - 0x26) ||
                 ((0x10000000210000dU >> ((ulong)(uVar6 - 0x26) & 0x3f) & 1) == 0)) &&
                (uVar6 != 0x7c)) {
          if (uVar6 != 0x7e) {
            printf("Unknown symbol (%c) in the formula (%s)\n",(ulong)(uint)(int)(char)bVar5,pStr);
            return 1;
          }
          uVar7 = (ulong)(uint)(int)(char)*pbVar3;
          if ((byte)(*pbVar3 + 0x85) < 0xe6) {
            pcVar9 = "Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n";
            goto LAB_00595ae9;
          }
        }
        bVar5 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (bVar5 != 0);
    }
    uVar7 = (ulong)(uint)*pnVars;
    if (*pnVars == 2) {
      if (0xfffffff7 < *pnPars - 9U) {
        return 0;
      }
      pcVar9 = "The number of parameters should be between 1 and %d\n";
      uVar7 = 8;
    }
    else {
      pcVar9 = "The number of input variables (%d) should be 2\n";
    }
LAB_00595ae9:
    printf(pcVar9,uVar7);
    return 1;
  }
  pcVar9 = "The number of opening and closing parentheses is not equal.";
LAB_00595a21:
  puts(pcVar9);
  return 1;
}

Assistant:

int Gia_FormStrCount( char * pStr, int * pnVars, int * pnPars )
{
    int i, Counter = 0;
    if ( pStr[0] != '(' )
    {
        printf( "The first symbol should be the opening parenthesis \"(\".\n" );
        return 1;
    }
    if ( pStr[strlen(pStr)-1] != ')' )
    {
        printf( "The last symbol should be the closing parenthesis \")\".\n" );
        return 1;
    }
    for ( i = 0; pStr[i]; i++ )
        if (  pStr[i] == '(' )
            Counter++;
        else if (  pStr[i] == ')' )
            Counter--;
    if ( Counter != 0 )
    {
        printf( "The number of opening and closing parentheses is not equal.\n" );
        return 1;
    }
    *pnVars = 0;
    *pnPars = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] >= 'a' && pStr[i] <= 'b' )
            *pnVars = Abc_MaxInt( *pnVars, pStr[i] - 'a' + 1 );
        else if ( pStr[i] >= 'p' && pStr[i] <= 's' )
            *pnPars = Abc_MaxInt( *pnPars, pStr[i] - 'p' + 1 );
        else if ( pStr[i] == '(' || pStr[i] == ')' )
        {}
        else if ( pStr[i] == '&' || pStr[i] == '|' || pStr[i] == '^' )
        {}
        else if ( pStr[i] == '?' || pStr[i] == ':' )
        {}
        else if ( pStr[i] == '~' )
        {
            if ( pStr[i+1] < 'a' || pStr[i+1] > 'z' )
            {
                printf( "Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n",  pStr[i+1] );
                return 1;
            }
        }
        else 
        {
            printf( "Unknown symbol (%c) in the formula (%s)\n", pStr[i], pStr );
            return 1;
        }
    }
    if ( *pnVars != FFTEST_MAX_VARS )
        { printf( "The number of input variables (%d) should be 2\n", *pnVars ); return 1; }
    if ( *pnPars < 1 || *pnPars > FFTEST_MAX_PARS )
        { printf( "The number of parameters should be between 1 and %d\n", FFTEST_MAX_PARS ); return 1; }
    return 0;
}